

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test::TestBody
          (CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test *this)

{
  int iVar1;
  int extraout_EAX;
  FileDescriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>_>
  *pVVar2;
  int *piVar3;
  Nonnull<const_char_*> pcVar4;
  undefined1 *puVar5;
  RepeatedField<int> *pRVar6;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  pointer pcVar7;
  char *in_R9;
  pointer *__ptr;
  bool bVar8;
  string_view name;
  FileDescriptorProto file_desc_proto;
  AssertHelper local_150;
  Message local_148;
  LogMessageData *local_140;
  undefined1 local_138 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  AssertHelper local_118;
  FileDescriptorProto local_110;
  
  name._M_str = "/test/test.proto";
  name._M_len = 0x10;
  this_00 = DescriptorPool::FindFileByName(&(this->super_CopySourceCodeInfoToTest).pool_,name);
  if (this_00 == (FileDescriptor *)0x0) {
    TestBody();
    iVar1 = extraout_EAX;
LAB_005dead3:
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,(long)iVar1,"index < size()");
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x32c,pcVar4);
LAB_005debbc:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_138);
  }
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  if ((((uint)local_110.field_0._impl_._has_bits_.has_bits_[0] & 0x10) != 0) &&
     (local_110.field_0._impl_.source_code_info_ == (SourceCodeInfo *)0x0)) {
    protobuf::internal::protobuf_assumption_failed
              ("!value || _impl_.source_code_info_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x33e3);
  }
  bVar8 = ((uint)local_110.field_0._impl_._has_bits_.has_bits_[0] & 0x10) == 0;
  local_148.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_148.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,bVar8);
  local_140 = (LogMessageData *)0x0;
  if (bVar8) {
    FileDescriptor::CopySourceCodeInfoTo(this_00,&local_110);
    puVar5 = (undefined1 *)local_110.field_0._impl_.source_code_info_;
    if (local_110.field_0._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
      puVar5 = _SourceCodeInfo_default_instance_;
    }
    local_148.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 4;
    local_150.data_._0_4_ = *(int *)((long)&((SourceCodeInfo *)puVar5)->field_0 + 0x20);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_138,"4","info.location_size()",(int *)&local_148,(int *)&local_150)
    ;
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message(&local_148);
      if (local_130._M_head_impl == (LogMessageData *)0x0) {
        pcVar7 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar7 = (pointer)((local_130._M_head_impl)->entry).full_filename_._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x3946,pcVar7);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
    }
    else {
      if (local_130._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_130._M_head_impl);
      }
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::SourceCodeInfo_Location>>
                         (&(((SourceCodeInfo *)puVar5)->field_0)._impl_.location_.
                           super_RepeatedPtrFieldBase,2);
      local_148.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 2;
      pRVar6 = &(pVVar2->field_0)._impl_.path_;
      local_150.data_._0_4_ =
           protobuf::internal::SooRep::size
                     (&pRVar6->soo_rep_,
                      (undefined1  [96])((undefined1  [96])pVVar2->field_0 & (undefined1  [96])0x4)
                      == (undefined1  [96])0x0);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_138,"2","foo_location.path_size()",(int *)&local_148,
                 (int *)&local_150);
      if (local_138[0] == (internal)0x0) {
        testing::Message::Message(&local_148);
        if (local_130._M_head_impl == (LogMessageData *)0x0) {
          pcVar7 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar7 = (pointer)((local_130._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x3949,pcVar7);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
      }
      else {
        if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             )local_130._M_head_impl != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_130,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130._M_head_impl);
        }
        local_150.data_._0_4_ = 4;
        iVar1 = protobuf::internal::SooRep::size
                          (&pRVar6->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(pRVar6->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                           (undefined1  [16])0x0);
        if (iVar1 < 1) goto LAB_005dead3;
        piVar3 = RepeatedField<int>::elements
                           (pRVar6,(undefined1  [16])
                                   ((undefined1  [16])(pRVar6->soo_rep_).field_0 &
                                   (undefined1  [16])0x4) == (undefined1  [16])0x0);
        local_118.data_._0_4_ = *piVar3;
        testing::internal::CmpHelperEQ<google::protobuf::FileDescriptorProto::_unnamed_type_1_,int>
                  ((internal *)&local_148,"FileDescriptorProto::kMessageTypeFieldNumber",
                   "foo_location.path(0)",(anon_enum_32 *)&local_150,(int *)&local_118);
        if (local_148.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_138);
          if (local_140 == (LogMessageData *)0x0) {
            pcVar7 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar7 = (pointer)(local_140->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x394a,pcVar7);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
          }
        }
        if (local_140 != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
        }
        local_150.data_._0_4_ = 0;
        iVar1 = protobuf::internal::SooRep::size
                          (&pRVar6->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(pRVar6->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                           (undefined1  [16])0x0);
        if (iVar1 < 2) {
          pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             (1,(long)iVar1,"index < size()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_138,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                     ,0x32c,pcVar4);
          goto LAB_005debbc;
        }
        piVar3 = RepeatedField<int>::elements
                           (pRVar6,(undefined1  [16])
                                   ((undefined1  [16])(pRVar6->soo_rep_).field_0 &
                                   (undefined1  [16])0x4) == (undefined1  [16])0x0);
        local_118.data_._0_4_ = piVar3[1];
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_148,"0","foo_location.path(1)",(int *)&local_150,
                   (int *)&local_118);
        if (local_148.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)local_138);
          if (local_140 == (LogMessageData *)0x0) {
            pcVar7 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar7 = (pointer)(local_140->entry).full_filename_._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x394b,pcVar7);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
          }
        }
        if (local_140 != (LogMessageData *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_140);
        }
        local_148.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 3;
        pRVar6 = &(pVVar2->field_0)._impl_.span_;
        local_150.data_._0_4_ =
             protobuf::internal::SooRep::size
                       (&pRVar6->soo_rep_,(*(byte *)((long)&pVVar2->field_0 + 0x20) & 4) == 0);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_138,"3","foo_location.span_size()",(int *)&local_148,
                   (int *)&local_150);
        if (local_138[0] != (internal)0x0) {
          if ((tuple<absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               )local_130._M_head_impl !=
              (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               )0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_130,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130._M_head_impl);
          }
          local_150.data_._0_4_ = 1;
          iVar1 = protobuf::internal::SooRep::size
                            (&pRVar6->soo_rep_,
                             (undefined1  [16])
                             ((undefined1  [16])(pRVar6->soo_rep_).field_0 & (undefined1  [16])0x4)
                             == (undefined1  [16])0x0);
          if (iVar1 < 1) {
            pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (0,(long)iVar1,"index < size()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_138,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                       ,0x32c,pcVar4);
            goto LAB_005debbc;
          }
          piVar3 = RepeatedField<int>::elements
                             (pRVar6,(undefined1  [16])
                                     ((undefined1  [16])(pRVar6->soo_rep_).field_0 &
                                     (undefined1  [16])0x4) == (undefined1  [16])0x0);
          local_118.data_._0_4_ = *piVar3;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_148,"1","foo_location.span(0)",(int *)&local_150,
                     (int *)&local_118);
          if (local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_138);
            if (local_140 == (LogMessageData *)0x0) {
              pcVar7 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar7 = (pointer)(local_140->entry).full_filename_._M_len;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x394d,pcVar7);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
            }
          }
          if (local_140 != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
          }
          local_150.data_._0_4_ = 0;
          iVar1 = protobuf::internal::SooRep::size
                            (&pRVar6->soo_rep_,
                             (undefined1  [16])
                             ((undefined1  [16])(pRVar6->soo_rep_).field_0 & (undefined1  [16])0x4)
                             == (undefined1  [16])0x0);
          if (iVar1 < 2) {
            pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (1,(long)iVar1,"index < size()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_138,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                       ,0x32c,pcVar4);
            goto LAB_005debbc;
          }
          piVar3 = RepeatedField<int>::elements
                             (pRVar6,(undefined1  [16])
                                     ((undefined1  [16])(pRVar6->soo_rep_).field_0 &
                                     (undefined1  [16])0x4) == (undefined1  [16])0x0);
          local_118.data_._0_4_ = piVar3[1];
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_148,"0","foo_location.span(1)",(int *)&local_150,
                     (int *)&local_118);
          if (local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_138);
            if (local_140 == (LogMessageData *)0x0) {
              pcVar7 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar7 = (pointer)(local_140->entry).full_filename_._M_len;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x394e,pcVar7);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
            }
          }
          if (local_140 != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
          }
          local_150.data_._0_4_ = 0xe;
          iVar1 = protobuf::internal::SooRep::size
                            (&pRVar6->soo_rep_,
                             (undefined1  [16])
                             ((undefined1  [16])(pRVar6->soo_rep_).field_0 & (undefined1  [16])0x4)
                             == (undefined1  [16])0x0);
          if (iVar1 < 3) {
            pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (2,(long)iVar1,"index < size()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_138,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                       ,0x32c,pcVar4);
            goto LAB_005debbc;
          }
          piVar3 = RepeatedField<int>::elements
                             (pRVar6,(undefined1  [16])
                                     ((undefined1  [16])(pRVar6->soo_rep_).field_0 &
                                     (undefined1  [16])0x4) == (undefined1  [16])0x0);
          local_118.data_._0_4_ = piVar3[2];
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_148,"14","foo_location.span(2)",(int *)&local_150,
                     (int *)&local_118);
          if (local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)local_138);
            if (local_140 == (LogMessageData *)0x0) {
              pcVar7 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar7 = (pointer)(local_140->entry).full_filename_._M_len;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x394f,pcVar7);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)local_138);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if ((long *)CONCAT71(local_138._1_7_,local_138[0]) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_138._1_7_,local_138[0]) + 8))();
            }
          }
          if (local_140 == (LogMessageData *)0x0) goto LAB_005de8a0;
          this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_140;
          __ptr_00._M_head_impl = local_140;
          goto LAB_005de89b;
        }
        testing::Message::Message(&local_148);
        if (local_130._M_head_impl == (LogMessageData *)0x0) {
          pcVar7 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar7 = (pointer)((local_130._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x394c,pcVar7);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if ((long *)CONCAT44(local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_148.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_148.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
    if (local_130._M_head_impl == (LogMessageData *)0x0) goto LAB_005de8a0;
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_130;
    __ptr_00._M_head_impl = local_130._M_head_impl;
  }
  else {
    testing::Message::Message((Message *)&local_150);
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_140;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_148,
               (AssertionResult *)"file_desc_proto.has_source_code_info()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3942,(char *)CONCAT71(local_138._1_7_,local_138[0]));
    testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_138._1_7_,local_138[0]) != &local_128) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_138._1_7_,local_138[0]),local_128._M_allocated_capacity + 1)
      ;
    }
    if ((long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_150.data_._4_4_,(int)local_150.data_) + 8))();
    }
    __ptr_00._M_head_impl = local_140;
    if (local_140 == (LogMessageData *)0x0) goto LAB_005de8a0;
  }
LAB_005de89b:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00._M_head_impl);
LAB_005de8a0:
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

TEST_F(CopySourceCodeInfoToTest, CopySourceCodeInfoTo) {
  const FileDescriptor* file_desc =
      ABSL_DIE_IF_NULL(pool_.FindFileByName("/test/test.proto"));
  FileDescriptorProto file_desc_proto;
  ASSERT_FALSE(file_desc_proto.has_source_code_info());

  file_desc->CopySourceCodeInfoTo(&file_desc_proto);
  const SourceCodeInfo& info = file_desc_proto.source_code_info();
  ASSERT_EQ(4, info.location_size());
  // Get the Foo message location
  const SourceCodeInfo_Location& foo_location = info.location(2);
  ASSERT_EQ(2, foo_location.path_size());
  EXPECT_EQ(FileDescriptorProto::kMessageTypeFieldNumber, foo_location.path(0));
  EXPECT_EQ(0, foo_location.path(1));      // Foo is the first message defined
  ASSERT_EQ(3, foo_location.span_size());  // Foo spans one line
  EXPECT_EQ(1, foo_location.span(0));      // Foo is declared on line 1
  EXPECT_EQ(0, foo_location.span(1));      // Foo starts at column 0
  EXPECT_EQ(14, foo_location.span(2));     // Foo ends on column 14
}